

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture3D::loadCompressed
          (Texture3D *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  code *pcVar1;
  int iVar2;
  CompressedTexFormat format;
  deBool dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar8;
  PixelBufferAccess *pPVar9;
  void *pvVar10;
  undefined1 local_b0 [8];
  PixelBufferAccess refLevelAccess;
  CompressedTexture *level;
  int levelNdx;
  allocator<char> local_61;
  string local_60;
  deUint32 local_3c;
  long lStack_38;
  deUint32 compressedFormat;
  Functions *gl;
  TexDecompressionParams *decompressionParams_local;
  CompressedTexture *levels_local;
  Texture3D *pTStack_18;
  int numLevels_local;
  Texture3D *this_local;
  
  gl = (Functions *)decompressionParams;
  decompressionParams_local = (TexDecompressionParams *)levels;
  levels_local._4_4_ = numLevels;
  pTStack_18 = this;
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lStack_38 = CONCAT44(extraout_var,iVar2);
  format = tcu::CompressedTexture::getFormat((CompressedTexture *)decompressionParams_local);
  local_3c = getGLFormat(format);
  if (*(long *)(lStack_38 + 0x290) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"glCompressedTexImage3D() is not supported",&local_61);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_60);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (this->m_glTexture == 0)) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,"m_glTexture",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x2e9);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  (**(code **)(lStack_38 + 0xb8))(0x806f,this->m_glTexture);
  level._4_4_ = 0;
  do {
    if (levels_local._4_4_ <= level._4_4_) {
      dVar7 = (**(code **)(lStack_38 + 0x800))();
      checkError(dVar7,"Texture upload failed",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                 ,0x2fd);
      return;
    }
    refLevelAccess.super_ConstPixelBufferAccess.m_data =
         decompressionParams_local + (long)level._4_4_ * 10;
    tcu::Texture3D::allocLevel(&this->m_refTexture,level._4_4_);
    pPVar9 = tcu::TextureLevelPyramid::getLevel
                       (&(this->m_refTexture).super_TextureLevelPyramid,level._4_4_);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_b0,pPVar9);
    do {
      dVar3 = ::deGetFalse();
      if (dVar3 != 0) {
LAB_0088332c:
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,
                   "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight() && level.getDepth() == refLevelAccess.getDepth()"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0x2f5);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      iVar2 = tcu::CompressedTexture::getWidth
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar4 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)local_b0);
      if (iVar2 != iVar4) goto LAB_0088332c;
      iVar2 = tcu::CompressedTexture::getHeight
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar4 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)local_b0);
      if (iVar2 != iVar4) goto LAB_0088332c;
      iVar2 = tcu::CompressedTexture::getDepth
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
      iVar4 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)local_b0);
      if (iVar2 != iVar4) goto LAB_0088332c;
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    tcu::CompressedTexture::decompress
              ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data,
               (PixelBufferAccess *)local_b0,(TexDecompressionParams *)gl);
    dVar7 = local_3c;
    pcVar1 = *(code **)(lStack_38 + 0x290);
    iVar2 = tcu::CompressedTexture::getWidth
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    iVar4 = tcu::CompressedTexture::getHeight
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    iVar5 = tcu::CompressedTexture::getDepth
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    iVar6 = tcu::CompressedTexture::getDataSize
                      ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    pvVar10 = tcu::CompressedTexture::getData
                        ((CompressedTexture *)refLevelAccess.super_ConstPixelBufferAccess.m_data);
    (*pcVar1)(0x806f,level._4_4_,dVar7,iVar2,iVar4,iVar5,0,iVar6,pvVar10);
    level._4_4_ = level._4_4_ + 1;
  } while( true );
}

Assistant:

void Texture3D::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	if (!gl.compressedTexImage3D)
		throw tcu::NotSupportedError("glCompressedTexImage3D() is not supported");

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_3D, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::CompressedTexture& level = levels[levelNdx];

		// Decompress to reference texture.
		m_refTexture.allocLevel(levelNdx);
		tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevel(levelNdx);
		TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
				  level.getHeight()	== refLevelAccess.getHeight() &&
				  level.getDepth()	== refLevelAccess.getDepth());
		level.decompress(refLevelAccess, decompressionParams);

		// Upload to GL texture in compressed form.
		gl.compressedTexImage3D(GL_TEXTURE_3D, levelNdx, compressedFormat,
								level.getWidth(), level.getHeight(), level.getDepth(), 0 /* border */, level.getDataSize(), level.getData());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}